

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromosome.h
# Opt level: O3

Chromosome * __thiscall
tsp::Chromosome::crossover
          (Chromosome *__return_storage_ptr__,Chromosome *this,Chromosome *chromosome,uint pcross)

{
  _Rb_tree_header *p_Var1;
  vector<int,_std::allocator<int>_> *this_00;
  int *__s;
  pointer piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  ulong __new_size;
  value_type value;
  int local_4c;
  Chromosome *local_48;
  Chromosome *local_40;
  Chromosome *local_38;
  
  p_Var1 = &(__return_storage_ptr__->region).mapOfCities._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(__return_storage_ptr__->region).mapOfCities._M_t._M_impl = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (__return_storage_ptr__->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (__return_storage_ptr__->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __new_size = (long)(this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
  this_00 = &__return_storage_ptr__->values;
  local_48 = __return_storage_ptr__;
  local_40 = this;
  local_38 = chromosome;
  std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size);
  __s = (__return_storage_ptr__->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start;
  piVar5 = (__return_storage_ptr__->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != piVar5) {
    memset(__s,0,((long)piVar5 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  uVar6 = (ulong)pcross;
  if (pcross != 0) {
    piVar2 = (local_40->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      __s[uVar4] = piVar2[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar6 != uVar4);
  }
  while ((ulong)(long)(int)pcross < __new_size) {
    local_4c = (local_38->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6 % __new_size];
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start,piVar5,&local_4c);
    piVar5 = (local_48->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (_Var3._M_current == piVar5) {
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[(int)pcross] = local_4c;
      pcross = pcross + 1;
    }
    uVar6 = uVar6 + 1;
  }
  return local_48;
}

Assistant:

Chromosome Chromosome::crossover(const Chromosome &chromosome, unsigned int pcross) {
        Chromosome child = Chromosome();

        auto size = this->values.size();
        child.values.resize(size);

        std::fill(child.values.begin(), child.values.end(), 0);

        int indexC = 0;
        int indexP = 0;

        for (indexP = 0; indexP < pcross; ++indexP) {
            child.values[indexC] = this->values[indexP];
            ++indexC;
        }

        while (indexC < size) {
            auto value = chromosome.values[indexP % size];
            auto it = std::find(child.values.begin(), child.values.end(), value);

            if (it == child.values.end()) {
                child.values[indexC] = value;
                ++indexC;
            }

            ++indexP;
        }

        return child;
    }